

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O1

int __thiscall jrtplib::RTPSession::IncrementTimestampDefault(RTPSession *this)

{
  uint32_t *puVar1;
  int iVar2;
  
  iVar2 = -0x3e;
  if (((this->created == true) && (iVar2 = -0x14, (this->packetbuilder).init == true)) &&
     (iVar2 = -0x12, (this->packetbuilder).deftsset == true)) {
    puVar1 = &(this->packetbuilder).timestamp;
    *puVar1 = *puVar1 + (this->packetbuilder).defaulttimestampinc;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int RTPSession::IncrementTimestampDefault()
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	int status;
	
	BUILDER_LOCK
	status = packetbuilder.IncrementTimestampDefault();
	BUILDER_UNLOCK
	return status;
}